

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ldscript.c
# Opt level: O2

Phdr ** endofsecdef(GlobalVars *gv,LinkedSection *ls)

{
  bool bVar1;
  bool bVar2;
  bool bVar3;
  char cVar4;
  char cVar5;
  int iVar6;
  uint uVar7;
  Phdr **__ptr;
  char *__s2;
  Phdr *pPVar8;
  char *pcVar9;
  MemoryDescr **ppMVar10;
  int iVar11;
  lword val;
  
  __ptr = (Phdr **)alloc(0x200);
  endofblock('{','}');
  bVar3 = true;
  bVar2 = false;
  iVar11 = 0;
LAB_0011252e:
  if (!bVar3) {
    if (bVar2) {
      free(__ptr);
      __ptr = (Phdr **)0x0;
    }
    else {
      __ptr[iVar11] = (Phdr *)0x0;
    }
    return __ptr;
  }
  cVar4 = getchr();
  switch(cVar4) {
  case ':':
    __s2 = getword();
    pcVar9 = scriptname;
    if (__s2 == (char *)0x0) {
      uVar7 = getlineno();
      error(0x4e,pcVar9,(ulong)uVar7);
      bVar3 = true;
    }
    else {
      pPVar8 = find_phdr(gv,__s2,(MemoryDescr *)0x0,(MemoryDescr *)0x0);
      pcVar9 = scriptname;
      if (pPVar8 == (Phdr *)0x0) {
        uVar7 = getlineno();
        iVar6 = 0x6f;
LAB_00112741:
        error(iVar6,pcVar9,(ulong)uVar7,__s2);
        goto LAB_00112751;
      }
      iVar6 = iVar11 + 1;
      __ptr[iVar11] = pPVar8;
      bVar3 = true;
      bVar1 = 0x3e < iVar11;
      iVar11 = iVar6;
      if (bVar1) {
        ierror("%sphdrcnt overrun","endofsecdef(): ");
        bVar3 = true;
      }
    }
    goto LAB_0011252e;
  case ';':
  case '<':
  case '?':
    goto switchD_00112553_caseD_3b;
  case '=':
    iVar6 = parse_expr(-1,&val);
    pcVar9 = scriptname;
    if (iVar6 != 0) {
      gv->filldata = (uint16_t)val;
      bVar3 = true;
      goto LAB_0011252e;
    }
    uVar7 = getlineno();
    iVar6 = 0x43;
    break;
  case '>':
  case '@':
switchD_00112553_caseD_3e:
    __s2 = getword();
    pcVar9 = scriptname;
    if (__s2 != (char *)0x0) {
      ppMVar10 = &memory_blocks;
      do {
        pcVar9 = scriptname;
        ppMVar10 = &((MemoryDescr *)ppMVar10)->next->next;
        if ((MemoryDescr *)ppMVar10 == (MemoryDescr *)0x0) {
          uVar7 = getlineno();
          iVar6 = 0x46;
          goto LAB_00112741;
        }
        iVar6 = strcmp(((MemoryDescr *)ppMVar10)->name,__s2);
      } while (iVar6 != 0);
      bVar3 = true;
      if (cVar4 == '>') {
        if (ls == (LinkedSection *)0x0) goto LAB_0011252e;
        ls->relocmem = (MemoryDescr *)ppMVar10;
        bVar3 = true;
        vdefmem = (MemoryDescr *)ppMVar10;
        if (ls->destmem != (MemoryDescr *)0x0) goto LAB_0011252e;
      }
      else if (ls == (LinkedSection *)0x0) goto LAB_0011252e;
      ls->destmem = (MemoryDescr *)ppMVar10;
      bVar3 = true;
      ldefmem = (MemoryDescr *)ppMVar10;
      goto LAB_0011252e;
    }
    uVar7 = getlineno();
    iVar6 = 0x4e;
    break;
  case 'A':
    cVar5 = getchr();
    if (cVar5 == 'T') {
      cVar5 = getchr();
      if (cVar5 != '>') {
        back(1);
        pcVar9 = scriptname;
        uVar7 = getlineno();
        error(0x42,pcVar9,(ulong)uVar7,0x3e);
      }
      goto switchD_00112553_caseD_3e;
    }
    iVar6 = 2;
    goto LAB_001126c4;
  default:
    goto switchD_00112553_default;
  }
  error(iVar6,pcVar9,(ulong)uVar7);
LAB_00112751:
  bVar3 = true;
  bVar2 = true;
  goto LAB_0011252e;
switchD_00112553_default:
  bVar3 = false;
  if (cVar4 != '\0') {
switchD_00112553_caseD_3b:
    iVar6 = 1;
LAB_001126c4:
    back(iVar6);
    bVar3 = false;
  }
  goto LAB_0011252e;
}

Assistant:

static struct Phdr **endofsecdef(struct GlobalVars *gv,
                                 struct LinkedSection *ls)
/* Parses syntax of everything which follows the '}' of a section
   definition. Memory-region pointers and fill-value will be initialized
   when the section-pointer 'ls' is given.
   On success the function returns a list of pointers to Phdr structures
   which were defined (terminated by a NULL pointer). This list must
   be deallocated by the caller!
   Syntax: } [>memregion] [AT>lma-region] [:phdr ...] [=fill] */
{
  const char *fn = "endofsecdef(): ";
  struct Phdr **pp = alloc(64 * sizeof(struct Phdr *));  /* it's ugly! */
  struct Phdr *phdr;
  struct MemoryDescr *md;
  int phdrcnt=0,done=0,err=0;
  char c,*buf;
  lword val;

  endofblock('{','}');

  while (!done) {
    switch (c = getchr()) {
      case '>':
      case '@':
      case 'A':
        if (c == 'A') {
          if (getchr() == 'T') {
            if (getchr() != '>') {
              back(1);
              error(66,scriptname,getlineno(),'>');  /* '>' expected */
            }
          }
          else {
            /* it's not AT, but maybe an ASSERT keyword, so get out */
            back(2);
            done = 1;
            break;
          }
        }
        if (buf = getword()) {
          if (md = find_memblock(buf)) {
            if (c == '>') {
              if (ls) {
                ls->relocmem = md;
                vdefmem = md;
                if (ls->destmem == NULL) {
                  ls->destmem = md;
                  ldefmem = md;
                }
              }
            }
            else if (ls) {
              ls->destmem = md;
              ldefmem = md;
            }
          }
          else {
            error(70,scriptname,getlineno(),buf);  /* Unknown memory region */
            err = 1;
          }
        }
        else {
          error(78,scriptname,getlineno());   /* missing argument */
          err = 1;
        }
        break;

      case ':':
        if (buf = getword()) {
          if (phdr = find_phdr(gv,buf,NULL,NULL)) {
            pp[phdrcnt++] = phdr;
            if (phdrcnt >= 64)
              ierror("%sphdrcnt overrun",fn);
          }
          else {
            error(111,scriptname,getlineno(),buf);  /* unknown PHDR */
            err = 1;
          }
        }
        else
          error(78,scriptname,getlineno());
        break;

      case '=':
        if (parse_expr(-1,&val)) {
          gv->filldata = (uint16_t)(val & 0xffff);
        }
        else {
          error(67,scriptname,getlineno());  /* Absolute number expected */
          err = 1;
        }
        break;

      case '\0':
        done = 1;
        break;

      default:
        done = 1;
        back(1);
        break;
    }
  }

  if (err) {
    free(pp);
    pp = NULL;
  }
  else
    pp[phdrcnt] = NULL;

  return pp;
}